

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zstd.c
# Opt level: O0

void COVER_best_destroy(COVER_best_t *best)

{
  pthread_mutex_t *in_RDI;
  
  if (in_RDI != (pthread_mutex_t *)0x0) {
    COVER_best_wait((COVER_best_t *)0x2fde77);
    if (*(long *)((long)in_RDI + 0x60) != 0) {
      free(*(void **)((long)in_RDI + 0x60));
    }
    pthread_mutex_destroy(in_RDI);
    pthread_cond_destroy((pthread_cond_t *)(in_RDI + 1));
  }
  return;
}

Assistant:

void COVER_best_destroy(COVER_best_t *best) {
  if (!best) {
    return;
  }
  COVER_best_wait(best);
  if (best->dict) {
    free(best->dict);
  }
  ZSTD_pthread_mutex_destroy(&best->mutex);
  ZSTD_pthread_cond_destroy(&best->cond);
}